

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test_export_simple_ltc(void)

{
  ostream *poVar1;
  vec<3,_float,_(glm::precision)0> vVar2;
  brdf_plot plot;
  ltc ltc;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_158;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_148 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [120];
  ltc local_a0;
  
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_export_simple_ltc started.");
  std::endl<char,std::char_traits<char>>(poVar1);
  ::ltc::ltc(&local_a0);
  local_128._0_8_ = 0x3f800000;
  local_128._8_8_ = (brdf *)0x0;
  local_118._0_8_ = 0x3f800000;
  local_118._8_8_ = 0;
  local_118._16_4_ = 1.0;
  ::ltc::set_ltc_matrix(&local_a0,(mat3 *)local_128);
  brdf_plot::brdf_plot((brdf_plot *)local_128);
  local_158._0_8_ = 0x3f800000;
  local_158.field_0.z = 1.0;
  vVar2 = glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                    ((vec<3,_float,_(glm::precision)0> *)&local_158.field_0);
  local_148[0]._8_4_ = vVar2.field_0._8_4_;
  local_148[0]._0_8_ = vVar2.field_0._0_8_;
  brdf_plot::set_view_dir((brdf_plot *)local_128,(vec3 *)&local_148[0].field_0);
  brdf_plot::set_resolution((brdf_plot *)local_128,0x200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148[0].field_0,"test_export_simple_ltc.png",
             (allocator<char> *)&local_158.field_0);
  brdf_plot::export_png((brdf_plot *)local_128,&local_a0.super_brdf,(string *)&local_148[0].field_0)
  ;
  std::__cxx11::string::~string((string *)&local_148[0].field_0);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: expored to \'test_export_simple_ltc.png\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = log_info();
  poVar1 = std::operator<<(poVar1,"VISUAL TEST: test_export_simple_ltc completed.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void test_export_simple_ltc()
{
    log_info() << "VISUAL TEST: test_export_simple_ltc started." << std::endl;

    ltc ltc;
    ltc.set_ltc_matrix(glm::mat3{1.0f});

    brdf_plot plot;
    plot.set_view_dir(glm::normalize(glm::vec3{1.0f, 0.0f, 1.0f}));
    plot.set_resolution(512);
    plot.export_png(&ltc, "test_export_simple_ltc.png");

    log_info() << "VISUAL TEST: expored to 'test_export_simple_ltc.png'"
        << std::endl;
    log_info() << "VISUAL TEST: test_export_simple_ltc completed." << std::endl;
}